

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O3

int cuddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  DdHalfWord DVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *moves;
  DdNode *pDVar9;
  uint uVar10;
  DdHalfWord DVar11;
  DdHalfWord x;
  DdHalfWord y;
  int iVar12;
  int iVar13;
  int iVar14;
  DdHalfWord x_00;
  int iVar15;
  DdHalfWord DVar16;
  bool bVar17;
  DdHalfWord local_9c;
  
  iVar12 = upper - lower;
  if (iVar12 < 0) {
    return 1;
  }
  iVar15 = -1;
  iVar13 = 0;
LAB_0080c416:
  if (table->siftMaxSwap <= ddTotalNumberSwapping) {
    return 1;
  }
  if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
    if (lower <= upper) {
      puVar4 = &table->subtables[lower].keys;
      uVar10 = 0xffffffff;
      iVar14 = lower;
      do {
        if ((int)uVar10 < (int)*puVar4) {
          iVar15 = iVar14;
          uVar10 = *puVar4;
        }
        puVar4 = puVar4 + 0xe;
        iVar14 = iVar14 + 1;
      } while (upper + 1 != iVar14);
    }
    DVar16 = upper;
    if (upper - iVar15 != 0) {
      uVar5 = Cudd_Random();
      DVar16 = iVar15 + (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                             % (long)(upper - iVar15)) + 1;
    }
    DVar11 = lower;
    if (0 < iVar15 + ~lower) {
      do {
        uVar5 = Cudd_Random();
        DVar11 = (DdHalfWord)
                 ((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                 (long)(iVar15 + ~lower));
      } while (DVar11 == DVar16);
    }
  }
  else {
    uVar5 = Cudd_Random();
    do {
      uVar6 = Cudd_Random();
      iVar2 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                   (long)(iVar12 + 1));
      iVar14 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                    (long)(iVar12 + 1));
    } while (iVar2 == iVar14);
    DVar16 = iVar14 + lower;
    DVar11 = iVar2 + lower;
  }
  DVar1 = DVar16;
  if ((int)DVar16 < (int)DVar11) {
    DVar1 = DVar11;
  }
  if ((int)DVar11 < (int)DVar16) {
    DVar16 = DVar11;
  }
  x = DVar1 - 1;
  iVar2 = table->keys - table->isolated;
  pDVar8 = (DdNode *)0x0;
  iVar14 = iVar2;
  DVar11 = DVar16;
  local_9c = DVar1;
  do {
    x_00 = DVar11;
    y = x_00 + 1;
    DVar11 = local_9c;
    if (y == x) {
      iVar3 = cuddSwapInPlace(table,x_00,x);
      if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
      goto LAB_0080c7ae;
      pDVar7->index = x_00;
      pDVar7->ref = x;
      *(int *)((long)&pDVar7->next + 4) = iVar3;
      (pDVar7->type).kids.T = pDVar8;
      iVar3 = cuddSwapInPlace(table,x,local_9c);
      if ((iVar3 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
      goto LAB_0080c7db;
      pDVar8->index = x;
      pDVar8->ref = local_9c;
      *(int *)((long)&pDVar8->next + 4) = iVar3;
      (pDVar8->type).kids.T = pDVar7;
      iVar3 = cuddSwapInPlace(table,x_00,x);
      pDVar7 = pDVar8;
      if ((iVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0))
      goto LAB_0080c7db;
      moves->index = x_00;
      y = x;
    }
    else {
      iVar3 = cuddSwapInPlace(table,x_00,y);
      if (x_00 == x) {
        if ((iVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0)) {
LAB_0080c7ae:
          pDVar7 = pDVar8;
          if (pDVar8 == (DdNode *)0x0) {
            return 0;
          }
          goto LAB_0080c7db;
        }
        moves->index = x_00;
      }
      else {
        if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
        goto LAB_0080c7ae;
        pDVar7->index = x_00;
        pDVar7->ref = y;
        *(int *)((long)&pDVar7->next + 4) = iVar3;
        (pDVar7->type).kids.T = pDVar8;
        iVar3 = cuddSwapInPlace(table,x,local_9c);
        if ((iVar3 == 0) || (moves = cuddDynamicAllocNode(table), moves == (DdNode *)0x0))
        goto LAB_0080c7db;
        moves->index = x;
        pDVar8 = pDVar7;
        DVar11 = y;
        y = local_9c;
        x_00 = x;
      }
    }
    moves->ref = y;
    *(int *)((long)&moves->next + 4) = iVar3;
    (moves->type).kids.T = pDVar8;
    x = x_00 - 1;
    if (((int)DVar1 <= (int)DVar11) || ((double)iVar14 * table->maxGrowth < (double)iVar3)) break;
    pDVar8 = moves;
    local_9c = x_00;
    if (iVar3 < iVar14) {
      iVar14 = iVar3;
    }
  } while( true );
  if ((int)DVar16 < (int)x_00) {
    iVar14 = cuddSwapInPlace(table,x,x_00);
    pDVar7 = moves;
    if ((iVar14 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0)) {
LAB_0080c7db:
      pDVar8 = table->nextFree;
      do {
        pDVar9 = pDVar7;
        pDVar7 = (pDVar9->type).kids.T;
        pDVar9->ref = 0;
        pDVar9->next = pDVar8;
        pDVar8 = pDVar9;
      } while (pDVar7 != (DdNode *)0x0);
      goto LAB_0080c7fd;
    }
    pDVar8->index = x;
    pDVar8->ref = x_00;
    *(int *)((long)&pDVar8->next + 4) = iVar14;
    (pDVar8->type).kids.T = moves;
    moves = pDVar8;
  }
  iVar14 = ddSiftingBackward(table,iVar2,(Move *)moves);
  pDVar8 = table->nextFree;
  if (iVar14 == 0) goto LAB_0080c7b5;
  do {
    pDVar7 = moves;
    moves = (pDVar7->type).kids.T;
    pDVar7->ref = 0;
    pDVar7->next = pDVar8;
    pDVar8 = pDVar7;
  } while (moves != (DdNode *)0x0);
  table->nextFree = pDVar7;
  bVar17 = iVar13 == iVar12;
  iVar13 = iVar13 + 1;
  if (bVar17) {
    return 1;
  }
  goto LAB_0080c416;
LAB_0080c7b5:
  do {
    pDVar9 = moves;
    moves = (pDVar9->type).kids.T;
    pDVar9->ref = 0;
    pDVar9->next = pDVar8;
    pDVar8 = pDVar9;
  } while (moves != (DdNode *)0x0);
LAB_0080c7fd:
  table->nextFree = pDVar9;
  return 0;
}

Assistant:

int
cuddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->size && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            max = -1;
            for (j = lower; j <= upper; j++) {
                if ((keys = table->subtables[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;
            } else{
                y = pivot + 1 + ((int) Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {
                x = lower;
            } else{
                do {
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
            }
        } else {
            x = ((int) Cudd_Random() % nvars) + lower;
            do {
                y = ((int) Cudd_Random() % nvars) + lower;
            } while (x == y);
        }
        previousSize = table->keys - table->isolated;
        moves = ddSwapAny(table,x,y);
        if (moves == NULL) goto cuddSwappingOutOfMem;
        result = ddSiftingBackward(table,previousSize,moves);
        if (!result) goto cuddSwappingOutOfMem;
        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
#if 0
        (void) fprintf(table->out,"#:t_SWAPPING %8d: tmp size\n",
                       table->keys - table->isolated);
#endif
    }

    return(1);

cuddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}